

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void __thiscall DPSprite::Tick(DPSprite *this)

{
  int iVar1;
  int iVar2;
  
  if ((this->processPending == true) && (iVar1 = this->Tics, iVar1 != -1)) {
    iVar2 = iVar1 + -1;
    this->Tics = iVar2;
    if ((iVar2 != 0 && (this->Flags & 4) != 0) && ((this->Owner->cheats & 0x200000) != 0)) {
      iVar2 = iVar1 + -2;
      this->Tics = iVar2;
    }
    if (iVar2 == 0) {
      SetState(this,this->State->NextState,false);
      return;
    }
  }
  return;
}

Assistant:

void DPSprite::Tick()
{
	if (processPending)
	{
		// drop tic count and possibly change state
		if (Tics != -1)	// a -1 tic count never changes
		{
			Tics--;

			// [BC] Apply double firing speed.
			if ((Flags & PSPF_POWDOUBLE) && Tics && (Owner->cheats & CF_DOUBLEFIRINGSPEED))
				Tics--;

			if (!Tics)
				SetState(State->GetNextState());
		}
	}
}